

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall mocker::ir::Interpreter::initExternalFuncs(Interpreter *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>_>
  *this_00;
  _Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  *p_Var1;
  size_t sVar2;
  __node_base_ptr p_Var3;
  __node_ptr p_Var4;
  char *pcVar5;
  ulong uVar6;
  size_type __dnew;
  _Scoped_node local_48;
  long local_38;
  
  this_00 = &this->externalFuncs;
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x5f79617272615f23;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x17) = 0x5f726f74635f235f;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xf;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x1f) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x27) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x2f) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x37) = 0;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x3f] = '\0';
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:295:25)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:295:25)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x5f79617272615f23;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x15) = 0x657a6973235f7961;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xd;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1d] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:297:42)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:297:42)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x23676e6972747323;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x16) = 0x6874676e656c2367;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xe;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1e] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:303:43)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:303:43)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x23676e6972747323;
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x17) = 0x64646123;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xb;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1b] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:308:40)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:308:40)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  p_Var4 = (__node_ptr)operator_new(0x50);
  (p_Var4->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &p_Var4->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  (p_Var4->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&(p_Var4->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  local_38 = 0x11;
  pcVar5 = (char *)std::__cxx11::string::_M_create((ulong *)p_Var1,(ulong)&local_38);
  *(char **)&(p_Var4->
             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
             ._M_storage._M_storage = pcVar5;
  *(long *)((long)&(p_Var4->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                   ._M_storage._M_storage + 0x10) = local_38;
  builtin_strncpy(pcVar5,"#string#substring",0x11);
  *(long *)((long)&(p_Var4->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                   ._M_storage._M_storage + 8) = local_38;
  *(undefined1 *)
   ((long)(p_Var4->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
          ._M_storage._M_storage.__align + local_38) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&(p_Var4->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:323:46)>
       ::_M_invoke;
  *(code **)((long)&(p_Var4->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:323:46)>
       ::_M_manager;
  local_48._M_node = p_Var4;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x23676e6972747323;
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x17) = 0x64726f23;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xb;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1b] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:334:40)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:334:40)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  p_Var4 = (__node_ptr)operator_new(0x50);
  (p_Var4->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &p_Var4->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  (p_Var4->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&(p_Var4->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  local_38 = 0x10;
  pcVar5 = (char *)std::__cxx11::string::_M_create((ulong *)p_Var1,(ulong)&local_38);
  *(char **)&(p_Var4->
             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
             ._M_storage._M_storage = pcVar5;
  *(long *)((long)&(p_Var4->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                   ._M_storage._M_storage + 0x10) = local_38;
  builtin_strncpy(pcVar5,"#string#parseInt",0x10);
  *(long *)((long)&(p_Var4->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                   ._M_storage._M_storage + 8) = local_38;
  *(undefined1 *)
   ((long)(p_Var4->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
          ._M_storage._M_storage.__align + local_38) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&(p_Var4->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:338:45)>
       ::_M_invoke;
  *(code **)((long)&(p_Var4->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:338:45)>
       ::_M_manager;
  local_48._M_node = p_Var4;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x23676e6972747323;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x16) = 0x5f726f74635f2367;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xe;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1e] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:345:25)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:345:25)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x49746567;
  *(undefined2 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x14) = 0x746e;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 6;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x16] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:348:35)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:348:35)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x6e697270;
  *(undefined2 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x14) = 0x74;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 5;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:354:34)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:354:34)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x6e697270;
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x13) = 0x6e6c746e;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 7;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x17] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:361:36)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:361:36)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x6e49746e6972705f;
  *(undefined2 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x18) = 0x74;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 9;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:367:38)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:367:38)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x6e6c746e6972705f;
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x17) = 0x746e496e;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 0xb;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x1b] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:371:40)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:371:40)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x6e69727453746567;
  *(undefined2 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x18) = 0x67;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 9;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:376:38)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:376:38)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x676e697274536f74;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 8;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x18] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(Interpreter **)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = this;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:387:37)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:387:37)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  local_48._M_h = (__hashtable_alloc *)this_00;
  local_48._M_node = (__node_ptr)operator_new(0x50);
  ((local_48._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &(local_48._M_node)->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)
       ((long)&((local_48._M_node)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
               ._M_storage._M_storage + 0x10);
  *(undefined4 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x10) = 0x636d656d;
  *(undefined2 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x14) = 0x7970;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 8) = 6;
  ((local_48._M_node)->
  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
  ._M_storage._M_storage.__data[0x16] = '\0';
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_node)->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x38) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:398:35)>
       ::_M_invoke;
  *(code **)((long)&((local_48._M_node)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>
                    ._M_storage._M_storage + 0x30) =
       std::
       _Function_handler<long_(const_std::vector<long,_std::allocator<long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp:398:35)>
       ::_M_manager;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar6 = sVar2 % (this->externalFuncs)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,uVar6,(key_type *)p_Var1,sVar2);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(&this_00->_M_h,uVar6,sVar2,local_48._M_node,1);
    local_48._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  return;
}

Assistant:

void Interpreter::initExternalFuncs() {
  using Args = const std::vector<std::int64_t> &;

  // #_array_#_ctor_ ( this arraySize elementSize )
  externalFuncs.emplace("#_array_#_ctor_",
                        [this](Args args) -> std::int64_t { assert(false); });
  // #_array_#size ( this )
  externalFuncs.emplace("#_array_#size", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });

  // #string#length ( this )
  externalFuncs.emplace("#string#length", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });
  // #string#add ( lhs rhs )
  externalFuncs.emplace("#string#add", [this](Args args) {
    auto lhsLen = externalFuncs["#string#length"]({args[0]});
    auto rhsLen = externalFuncs["#string#length"]({args[1]});
    std::int64_t length = lhsLen + rhsLen;

    char *resInstPtr = (char *)fastMalloc(length + 8);
    *(std::int64_t *)resInstPtr = length;
    resInstPtr += 8;

    std::memcpy(resInstPtr, (void *)args[0], (std::size_t)lhsLen);
    std::memcpy((char *)resInstPtr + lhsLen, (void *)args[1],
                (std::size_t)rhsLen);
    return (std::int64_t)resInstPtr;
  });
  // #string#substring ( this left right )
  externalFuncs.emplace("#string#substring", [this](Args args) {
    auto len = args[2] - args[1];
    char *resInstPtr = (char *)fastMalloc(len + 8);
    *(std::int64_t *)(resInstPtr) = len;
    resInstPtr += 8;

    auto srcContentPtr = (char *)args[0] + args[1];
    std::memcpy(resInstPtr, srcContentPtr, (std::size_t)len);
    return (std::int64_t)resInstPtr;
  });
  // #string#ord ( this pos )
  externalFuncs.emplace("#string#ord", [](Args args) {
    return (std::int64_t) * ((char *)args[0] + args[1]);
  });
  // #string#parseInt ( this )
  externalFuncs.emplace("#string#parseInt", [](Args args) {
    auto len = *((std::int64_t *)args[0] - 1);
    std::string str{(char *)args[0], (char *)args[0] + len};
    return std::stoll(str);
  });
  // #string#_ctor_ ( this )
  externalFuncs.emplace("#string#_ctor_",
                        [](Args args) -> std::int64_t { assert(false); });

  // getInt (  )
  externalFuncs.emplace("getInt", [](Args args) {
    std::int64_t res;
    std::cin >> res;
    return res;
  });
  // print ( str )
  externalFuncs.emplace("print", [this](Args args) {
    auto len = externalFuncs["#string#length"]({args[0]});
    auto str = std::string{(char *)args[0], (char *)args[0] + len};
    std::cout << str;
    return 0;
  });
  // println ( str )
  externalFuncs.emplace("println", [this](Args args) {
    externalFuncs["print"]({args[0]});
    std::cout << std::endl;
    return 0;
  });
  // _printInt ( x )
  externalFuncs.emplace("_printInt", [this](Args args) {
    std::cout << args[0];
    return 0;
  });
  externalFuncs.emplace("_printlnInt", [this](Args args) {
    std::cout << args[0] << std::endl;
    return 0;
  });
  // getString (  )
  externalFuncs.emplace("getString", [this](Args args) {
    std::string str;
    std::cin >> str;

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });
  // toString ( i )
  externalFuncs.emplace("toString", [this](Args args) {
    auto str = std::to_string(args[0]);

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });

  // memcpy ( dest src count )
  externalFuncs.emplace("memcpy", [](Args args) {
    std::memcpy((void *)args[0], (void *)args[1], (std::size_t)args[2]);
    return 0;
  });
}